

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_MoveBlock(CMatchFinder *p)

{
  CMatchFinder *p_local;
  
  memmove(p->bufferBase,p->buffer + -(ulong)p->keepSizeBefore,
          (ulong)((p->streamPos - p->pos) + p->keepSizeBefore));
  p->buffer = p->bufferBase + p->keepSizeBefore;
  return;
}

Assistant:

void MatchFinder_MoveBlock(CMatchFinder* p) {
  memmove(p->bufferBase,
          p->buffer - p->keepSizeBefore,
          (size_t)(p->streamPos - p->pos + p->keepSizeBefore));
  p->buffer = p->bufferBase + p->keepSizeBefore;
}